

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O2

void dbgpbval(dbgcxdef *ctx,dattyp typ,uchar *val,_func_void_void_ptr_char_ptr_int *dispfn,
             void *dispctx)

{
  ushort uVar1;
  uint uVar2;
  size_t sVar3;
  int typ_00;
  char *pcVar4;
  int iStack_70;
  uint local_5c;
  char buf [40];
  
  switch(typ) {
  case 1:
    sprintf(buf,"%ld",(long)*(int *)val);
    sVar3 = strlen(buf);
    iStack_70 = (int)sVar3;
    goto LAB_0012041d;
  case 2:
    uVar1 = *(ushort *)val;
    typ_00 = 2;
    break;
  case 3:
    uVar1 = *(ushort *)val;
    (*dispfn)(dispctx,"\'",1);
    if (uVar1 - 2 != 0) {
      (*dispfn)(dispctx,(char *)(val + 2),uVar1 - 2);
    }
    (*dispfn)(dispctx,"\'",1);
    return;
  default:
    pcVar4 = "[unknown type]";
    iStack_70 = 0xe;
    goto LAB_0012047f;
  case 5:
    pcVar4 = "nil";
    iStack_70 = 3;
    goto LAB_0012047f;
  case 7:
    (*dispfn)(dispctx,"[",1);
    local_5c = *(ushort *)val - 2;
    buf._0_8_ = val + 2;
    uVar2 = local_5c;
    while (uVar2 != 0) {
      dbgpbval(ctx,(int)*(char *)buf._0_8_,(uchar *)(buf._0_8_ + 1),dispfn,dispctx);
      lstadv((uchar **)buf,&local_5c);
      uVar2 = 0;
      if (local_5c != 0) {
        (*dispfn)(dispctx," ",1);
        uVar2 = local_5c;
      }
    }
    (*dispfn)(dispctx,"]",1);
    return;
  case 8:
    pcVar4 = "true";
    iStack_70 = 4;
    goto LAB_0012047f;
  case 10:
    (*dispfn)(dispctx,"&",1);
    uVar1 = *(ushort *)val;
    typ_00 = 1;
    break;
  case 0xd:
    (*dispfn)(dispctx,"&",1);
    uVar1 = *(ushort *)val;
    typ_00 = 3;
  }
  iStack_70 = dbgnam(ctx,buf,typ_00,(uint)uVar1);
LAB_0012041d:
  if (iStack_70 == 0) {
    return;
  }
  pcVar4 = buf;
LAB_0012047f:
  (*dispfn)(dispctx,pcVar4,iStack_70);
  return;
}

Assistant:

static void dbgpbval(dbgcxdef *ctx, dattyp typ, uchar *val,
                     void (*dispfn)(void *, const char *, int),
                     void *dispctx)
{
    char  buf[TOKNAMMAX + 1];
    char *p = buf;
    uint  len;

    switch(typ)
    {
    case DAT_NUMBER:
        sprintf(buf, "%ld", (long)osrp4s(val));
        len = strlen(buf);
        break;
        
    case DAT_OBJECT:
        len = dbgnam(ctx, buf, TOKSTOBJ, osrp2(val));
        break;
        
    case DAT_SSTRING:
        len = osrp2(val) - 2;
        p = (char *)val + 2;
        break;
        
    case DAT_NIL:
        p = "nil";
        len = 3;
        break;

    case DAT_LIST:
        (*dispfn)(dispctx, "[", 1);
        len = osrp2(val) - 2;
        p = (char *)val + 2;
        while (len)
        {
            dbgpbval(ctx, (dattyp)*p, (uchar *)(p + 1), dispfn, dispctx);
            lstadv((uchar **)&p, &len);
            if (len) (*dispfn)(dispctx, " ", 1);
        }
        (*dispfn)(dispctx, "]", 1);
        len = 0;
        break;
        
    case DAT_TRUE:
        p = "true";
        len = 4;
        break;
        
    case DAT_FNADDR:
        (*dispfn)(dispctx, "&", 1);
        len = dbgnam(ctx, buf, TOKSTFUNC, osrp2(val));
        break;
        
    case DAT_PROPNUM:
        (*dispfn)(dispctx, "&", 1);
        len = dbgnam(ctx, buf, TOKSTPROP, osrp2(val));
        break;
        
    default:
        p = "[unknown type]";
        len = 14;
        break;
    }

    if (typ == DAT_SSTRING) (*dispfn)(dispctx, "'", 1);
    if (len) (*dispfn)(dispctx, p, len);
    if (typ == DAT_SSTRING) (*dispfn)(dispctx, "'", 1);
}